

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseDocument(TidyDocImpl *doc)

{
  ulong uVar1;
  Bool BVar2;
  int iVar3;
  Node *pNVar4;
  AttVal *pAVar5;
  Node *node_00;
  Node *head;
  ulong dtmode;
  Bool htmlOut;
  AttVal *xmlns;
  Node *doctype;
  Node *html;
  Node *node;
  TidyDocImpl *doc_local;
  
  xmlns = (AttVal *)0x0;
LAB_0014ecc4:
  do {
    doctype = prvTidyGetToken(doc,IgnoreWhitespace);
    if (doctype == (Node *)0x0) {
LAB_0014efdd:
      if ((doc->config).value[1].v != 0) {
        prvTidyAccessibilityChecks(doc);
      }
      pNVar4 = prvTidyFindHTML(doc);
      if (pNVar4 == (Node *)0x0) {
        pNVar4 = prvTidyInferredTag(doc,TidyTag_HTML);
        prvTidyInsertNodeAtEnd(&doc->root,pNVar4);
        ParseHTMLWithNode(doc,pNVar4);
      }
      pNVar4 = prvTidyFindTITLE(doc);
      if (pNVar4 == (Node *)0x0) {
        pNVar4 = prvTidyFindHEAD(doc);
        if ((int)(doc->config).value[6].v != 1) {
          prvTidyReport(doc,pNVar4,(Node *)0x0,0x262);
        }
        node_00 = prvTidyInferredTag(doc,TidyTag_TITLE);
        prvTidyInsertNodeAtEnd(pNVar4,node_00);
      }
      else if (((pNVar4->content == (Node *)0x0) && ((int)(doc->config).value[6].v != 1)) &&
              (BVar2 = prvTidyIsHTML5Mode(doc), BVar2 != no)) {
        prvTidyReport(doc,pNVar4,(Node *)0x0,0x293);
      }
      AttributeChecks(doc,&doc->root);
      ReplaceObsoleteElements(doc,&doc->root);
      prvTidyDropEmptyElements(doc,&doc->root);
      CleanSpaces(doc,&doc->root);
      if ((int)(doc->config).value[0x17].v != 0) {
        EncloseBodyText(doc);
      }
      if ((int)(doc->config).value[0x16].v != 0) {
        EncloseBlockText(doc,&doc->root);
      }
      return;
    }
    if (doctype->type == XmlDecl) {
      doc->xmlDetected = yes;
      pNVar4 = prvTidyFindXmlDecl(doc);
      if ((pNVar4 != (Node *)0x0) && ((doc->root).content != (Node *)0x0)) {
        prvTidyReport(doc,&doc->root,doctype,0x235);
        prvTidyFreeNode(doc,doctype);
        goto LAB_0014ecc4;
      }
      if ((1 < doctype->line) || (doctype->column != 1)) {
        prvTidyReport(doc,&doc->root,doctype,0x275);
      }
    }
    BVar2 = InsertMisc(&doc->root,doctype);
    if (BVar2 == no) {
      if (doctype->type == DocTypeTag) {
        if (xmlns == (AttVal *)0x0) {
          prvTidyInsertNodeAtEnd(&doc->root,doctype);
          xmlns = (AttVal *)doctype;
        }
        else {
          prvTidyReport(doc,&doc->root,doctype,0x235);
          prvTidyFreeNode(doc,doctype);
        }
      }
      else {
        if (doctype->type != EndTag) {
          if ((((doctype->type == StartTag) && (doctype != (Node *)0x0)) &&
              (doctype->tag != (Dict *)0x0)) &&
             (((doctype->tag->id == TidyTag_HTML &&
               (pAVar5 = prvTidyAttrGetById(doctype,TidyAttr_XMLNS), pAVar5 != (AttVal *)0x0)) &&
              ((pAVar5->value != (tmbstr)0x0 &&
               (iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"http://www.w3.org/1999/xhtml"),
               iVar3 == 0)))))) {
            iVar3 = (int)(doc->config).value[0x21].v;
            doc->lexer->isvoyager = yes;
            prvTidySetOptionBool(doc,TidyXhtmlOut,(uint)((iVar3 != 0 ^ 0xffU) & 1));
            prvTidySetOptionBool(doc,TidyXmlOut,(uint)((iVar3 != 0 ^ 0xffU) & 1));
            if (iVar3 == 0) {
              prvTidySetOptionBool(doc,TidyUpperCaseTags,no);
              prvTidySetOptionInt(doc,TidyUpperCaseAttrs,0);
            }
          }
          if (((doctype->type != StartTag) || (doctype == (Node *)0x0)) ||
             ((doctype->tag == (Dict *)0x0 || (doctype->tag->id != TidyTag_HTML)))) {
            prvTidyUngetToken(doc);
            doctype = prvTidyInferredTag(doc,TidyTag_HTML);
          }
          pNVar4 = prvTidyFindDocType(doc);
          if (pNVar4 == (Node *)0x0) {
            uVar1 = (doc->config).value[0xe].v;
            if ((uVar1 != 1) && ((int)(doc->config).value[6].v != 1)) {
              prvTidyReport(doc,(Node *)0x0,(Node *)0x0,600);
            }
            if ((uVar1 != 2) && (uVar1 != 0)) {
              prvTidyAdjustTags(doc);
            }
          }
          prvTidyInsertNodeAtEnd(&doc->root,doctype);
          ParseHTMLWithNode(doc,doctype);
          goto LAB_0014efdd;
        }
        prvTidyReport(doc,&doc->root,doctype,0x235);
        prvTidyFreeNode(doc,doctype);
      }
    }
  } while( true );
}

Assistant:

void TY_(ParseDocument)(TidyDocImpl* doc)
{
    Node *node, *html, *doctype = NULL;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->type == XmlDecl)
        {
            doc->xmlDetected = yes;

            if (TY_(FindXmlDecl)(doc) && doc->root.content)
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
            if (node->line > 1 || node->column != 1)
            {
                TY_(Report)(doc, &doc->root, node, SPACE_PRECEDING_XMLDECL);
            }
        }

        /* deal with comments etc. */
        if (InsertMisc( &doc->root, node ))
            continue;

        if (node->type == DocTypeTag)
        {
            if (doctype == NULL)
            {
                TY_(InsertNodeAtEnd)( &doc->root, node);
                doctype = node;
            }
            else
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if (node->type == StartTag && nodeIsHTML(node))
        {
            AttVal *xmlns = TY_(AttrGetById)(node, TidyAttr_XMLNS);

            if (AttrValueIs(xmlns, XHTML_NAMESPACE))
            {
                Bool htmlOut = cfgBool( doc, TidyHtmlOut );
                doc->lexer->isvoyager = yes;                  /* Unless plain HTML */
                TY_(SetOptionBool)( doc, TidyXhtmlOut, !htmlOut ); /* is specified, output*/
                TY_(SetOptionBool)( doc, TidyXmlOut, !htmlOut );   /* will be XHTML. */

                /* adjust other config options, just as in config.c */
                if ( !htmlOut )
                {
                    TY_(SetOptionBool)( doc, TidyUpperCaseTags, no );
                    TY_(SetOptionInt)( doc, TidyUpperCaseAttrs, no );
                }
            }
        }

        if ( node->type != StartTag || !nodeIsHTML(node) )
        {
            TY_(UngetToken)( doc );
            html = TY_(InferredTag)(doc, TidyTag_HTML);
        }
        else
            html = node;

        /*\
         *  #72, avoid MISSING_DOCTYPE if show-body-only.
         *  #191, also if --doctype omit, that is TidyDoctypeOmit
         *  #342, adjust tags to html4-- if not 'auto' or 'html5'
        \*/
        if (!TY_(FindDocType)(doc))
        {
            ulong dtmode = cfg( doc, TidyDoctypeMode );
            if ((dtmode != TidyDoctypeOmit) && !showingBodyOnly(doc))
                TY_(Report)(doc, NULL, NULL, MISSING_DOCTYPE);
            if ((dtmode != TidyDoctypeAuto) && (dtmode != TidyDoctypeHtml5))
            {
                /*\
                 *  Issue #342 - if not doctype 'auto', or 'html5'
                 *  then reset mode htm4-- parsing
                \*/
                TY_(AdjustTags)(doc); /* Dynamically modify the tags table to html4-- mode */
            }
        }
        TY_(InsertNodeAtEnd)( &doc->root, html);
        ParseHTMLWithNode( doc, html );
        break;
    }

    /* do this before any more document fixes */
    if ( cfg( doc, TidyAccessibilityCheckLevel ) > 0 )
        TY_(AccessibilityChecks)( doc );

    if (!TY_(FindHTML)(doc))
    {
        /* a later check should complain if <body> is empty */
        html = TY_(InferredTag)(doc, TidyTag_HTML);
        TY_(InsertNodeAtEnd)( &doc->root, html);
        ParseHTMLWithNode( doc, html );
    }

    node = TY_(FindTITLE)(doc);
    if (!node)
    {
        Node* head = TY_(FindHEAD)(doc);
        /* #72, avoid MISSING_TITLE_ELEMENT if show-body-only (but allow InsertNodeAtEnd to avoid new warning) */
        if (!showingBodyOnly(doc))
        {
            TY_(Report)(doc, head, NULL, MISSING_TITLE_ELEMENT);
        }
        TY_(InsertNodeAtEnd)(head, TY_(InferredTag)(doc, TidyTag_TITLE));
    }
    else if (!node->content && !showingBodyOnly(doc))
    {
        /* Is #839 - warn node is blank in HTML5 */
        if (TY_(IsHTML5Mode)(doc))
        {
            TY_(Report)(doc, node, NULL, BLANK_TITLE_ELEMENT);
        }
    }

    AttributeChecks(doc, &doc->root);
    ReplaceObsoleteElements(doc, &doc->root);
    TY_(DropEmptyElements)(doc, &doc->root);
    CleanSpaces(doc, &doc->root);

    if (cfgBool(doc, TidyEncloseBodyText))
        EncloseBodyText(doc);
    if (cfgBool(doc, TidyEncloseBlockText))
        EncloseBlockText(doc, &doc->root);
}